

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclSource.cpp
# Opt level: O2

char * xmrig::OclSource::get(void)

{
  FILE *__stream;
  size_t __nmemb;
  char *__ptr;
  
  __stream = fopen("cl/cryptonight_aio.cl","r");
  fseek(__stream,0,2);
  __nmemb = ftell(__stream);
  fseek(__stream,0,0);
  __ptr = (char *)calloc(__nmemb,1);
  fread(__ptr,1,__nmemb,__stream);
  fclose(__stream);
  return __ptr;
}

Assistant:

const char *xmrig::OclSource::get()
{
    FILE *file;
    file = fopen("cl/cryptonight_aio.cl", "r");
    fseek(file, 0L, SEEK_END);
    long num_bytes = ftell(file);
    fseek(file, 0L, SEEK_SET);
    char* buffer = (char*)calloc(num_bytes, sizeof(char));	
    fread(buffer, sizeof(char), num_bytes, file);
    fclose(file);

    return buffer;
}